

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl,int force_flush)

{
  uchar uVar1;
  int iVar2;
  uint ret_00;
  size_t sVar3;
  ulong len_00;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar4;
  size_t remaining;
  mbedtls_record rec;
  mbedtls_ssl_protocol_version tls_ver;
  size_t out_buf_len;
  size_t protected_record_size;
  uint i;
  int flush;
  size_t len;
  int done;
  int ret;
  int force_flush_local;
  mbedtls_ssl_context *ssl_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  _i = ssl->out_msglen;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0xb84,"=> write record");
  rec.data_len._4_4_ = ssl->tls_version;
  mbedtls_ssl_write_version(ssl->out_hdr + 1,(uint)ssl->conf->transport,rec.data_len._4_4_);
  *(undefined8 *)ssl->out_ctr = *(undefined8 *)ssl->cur_out_ctr;
  mbedtls_put_unaligned_uint16(ssl->out_len,(ushort)_i << 8 | (ushort)_i >> 8);
  if (ssl->transform_out != (mbedtls_ssl_transform *)0x0) {
    rec._8_8_ = ssl->out_iv;
    rec.buf = (uchar *)(0x42d - ((long)ssl->out_iv - (long)ssl->out_buf));
    rec.data_offset = ssl->out_msglen;
    rec.buf_len = (long)ssl->out_msg - rec._8_8_;
    remaining = *(size_t *)ssl->out_ctr;
    mbedtls_ssl_write_version(rec.ctr + 1,(uint)ssl->conf->transport,rec.data_len._4_4_);
    rec.ctr[0] = (uint8_t)ssl->out_msgtype;
    iVar2 = mbedtls_ssl_encrypt_buf
                      (ssl,ssl->transform_out,(mbedtls_record *)&remaining,ssl->conf->f_rng,
                       ssl->conf->p_rng);
    if (iVar2 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xbb1,"ssl_encrypt_buf",iVar2);
      return iVar2;
    }
    if (rec.buf_len != 0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xbb6,"should never happen");
      return -0x6c00;
    }
    ssl->out_msgtype = (uint)rec.ctr[0];
    _i = rec.data_offset;
    ssl->out_msglen = rec.data_offset;
    mbedtls_put_unaligned_uint16
              (ssl->out_len,(ushort)rec.data_offset << 8 | (ushort)rec.data_offset >> 8);
  }
  sVar3 = mbedtls_ssl_out_hdr_len(ssl);
  len_00 = _i + sVar3;
  if (ssl->conf->transport == '\x01') {
    iVar2 = ssl_get_remaining_space_in_datagram(ssl);
    if (iVar2 < 0) {
      return iVar2;
    }
    if ((ulong)(long)iVar2 < len_00) {
      return -0x6c00;
    }
  }
  *ssl->out_hdr = (uchar)ssl->out_msgtype;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0xbdb,"output record: msgtype = %u, version = [%u:%u], msglen = %zu",
             (ulong)*ssl->out_hdr,CONCAT44(uVar4,(uint)ssl->out_hdr[1]),(uint)ssl->out_hdr[2],_i);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0xbde,"output record sent to network",ssl->out_hdr,len_00);
  ssl->out_left = len_00 + ssl->out_left;
  ssl->out_hdr = ssl->out_hdr + len_00;
  mbedtls_ssl_update_out_pointers(ssl,ssl->transform_out);
  protected_record_size._0_4_ = 8;
  while ((sVar3 = mbedtls_ssl_ep_len(ssl), sVar3 < (uint)protected_record_size &&
         (uVar1 = ssl->cur_out_ctr[(uint)protected_record_size - 1] + '\x01',
         ssl->cur_out_ctr[(uint)protected_record_size - 1] = uVar1, uVar1 == '\0'))) {
    protected_record_size._0_4_ = (uint)protected_record_size - 1;
  }
  sVar3 = mbedtls_ssl_ep_len(ssl);
  if ((uint)protected_record_size == sVar3) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0xbec,"outgoing message counter would wrap");
    ssl_local._4_4_ = -0x6b80;
  }
  else {
    protected_record_size._4_4_ = force_flush;
    if ((ssl->conf->transport == '\x01') && (force_flush == 0)) {
      ret_00 = ssl_get_remaining_payload_in_datagram(ssl);
      if ((int)ret_00 < 0) {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xbf8,"ssl_get_remaining_payload_in_datagram",ret_00);
        return ret_00;
      }
      if (ret_00 == 0) {
        protected_record_size._4_4_ = 1;
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xc02,"Still %u bytes available in current datagram",(ulong)ret_00);
      }
    }
    if ((protected_record_size._4_4_ == 1) &&
       (ssl_local._4_4_ = mbedtls_ssl_flush_output(ssl), ssl_local._4_4_ != 0)) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xc09,"mbedtls_ssl_flush_output",ssl_local._4_4_);
    }
    else {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xc0d,"<= write record");
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl, int force_flush)
{
    int ret, done = 0;
    size_t len = ssl->out_msglen;
    int flush = force_flush;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write record"));

    if (!done) {
        unsigned i;
        size_t protected_record_size;
#if defined(MBEDTLS_SSL_VARIABLE_BUFFER_LENGTH)
        size_t out_buf_len = ssl->out_buf_len;
#else
        size_t out_buf_len = MBEDTLS_SSL_OUT_BUFFER_LEN;
#endif
        /* Skip writing the record content type to after the encryption,
         * as it may change when using the CID extension. */
        mbedtls_ssl_protocol_version tls_ver = ssl->tls_version;
#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
        /* TLS 1.3 still uses the TLS 1.2 version identifier
         * for backwards compatibility. */
        if (tls_ver == MBEDTLS_SSL_VERSION_TLS1_3) {
            tls_ver = MBEDTLS_SSL_VERSION_TLS1_2;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */
        mbedtls_ssl_write_version(ssl->out_hdr + 1, ssl->conf->transport,
                                  tls_ver);

        memcpy(ssl->out_ctr, ssl->cur_out_ctr, MBEDTLS_SSL_SEQUENCE_NUMBER_LEN);
        MBEDTLS_PUT_UINT16_BE(len, ssl->out_len, 0);

        if (ssl->transform_out != NULL) {
            mbedtls_record rec;

            rec.buf         = ssl->out_iv;
            rec.buf_len     = out_buf_len - (ssl->out_iv - ssl->out_buf);
            rec.data_len    = ssl->out_msglen;
            rec.data_offset = ssl->out_msg - rec.buf;

            memcpy(&rec.ctr[0], ssl->out_ctr, sizeof(rec.ctr));
            mbedtls_ssl_write_version(rec.ver, ssl->conf->transport, tls_ver);
            rec.type = ssl->out_msgtype;

#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
            /* The CID is set by mbedtls_ssl_encrypt_buf(). */
            rec.cid_len = 0;
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */

            if ((ret = mbedtls_ssl_encrypt_buf(ssl, ssl->transform_out, &rec,
                                               ssl->conf->f_rng, ssl->conf->p_rng)) != 0) {
                MBEDTLS_SSL_DEBUG_RET(1, "ssl_encrypt_buf", ret);
                return ret;
            }

            if (rec.data_offset != 0) {
                MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
                return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
            }

            /* Update the record content type and CID. */
            ssl->out_msgtype = rec.type;
#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
            memcpy(ssl->out_cid, rec.cid, rec.cid_len);
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */
            ssl->out_msglen = len = rec.data_len;
            MBEDTLS_PUT_UINT16_BE(rec.data_len, ssl->out_len, 0);
        }

        protected_record_size = len + mbedtls_ssl_out_hdr_len(ssl);

#if defined(MBEDTLS_SSL_PROTO_DTLS)
        /* In case of DTLS, double-check that we don't exceed
         * the remaining space in the datagram. */
        if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
            ret = ssl_get_remaining_space_in_datagram(ssl);
            if (ret < 0) {
                return ret;
            }

            if (protected_record_size > (size_t) ret) {
                /* Should never happen */
                return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
            }
        }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        /* Now write the potentially updated record content type. */
        ssl->out_hdr[0] = (unsigned char) ssl->out_msgtype;

        MBEDTLS_SSL_DEBUG_MSG(3, ("output record: msgtype = %u, "
                                  "version = [%u:%u], msglen = %" MBEDTLS_PRINTF_SIZET,
                                  ssl->out_hdr[0], ssl->out_hdr[1],
                                  ssl->out_hdr[2], len));

        MBEDTLS_SSL_DEBUG_BUF(4, "output record sent to network",
                              ssl->out_hdr, protected_record_size);

        ssl->out_left += protected_record_size;
        ssl->out_hdr  += protected_record_size;
        mbedtls_ssl_update_out_pointers(ssl, ssl->transform_out);

        for (i = 8; i > mbedtls_ssl_ep_len(ssl); i--) {
            if (++ssl->cur_out_ctr[i - 1] != 0) {
                break;
            }
        }

        /* The loop goes to its end if the counter is wrapping */
        if (i == mbedtls_ssl_ep_len(ssl)) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("outgoing message counter would wrap"));
            return MBEDTLS_ERR_SSL_COUNTER_WRAPPING;
        }
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        flush == SSL_DONT_FORCE_FLUSH) {
        size_t remaining;
        ret = ssl_get_remaining_payload_in_datagram(ssl);
        if (ret < 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "ssl_get_remaining_payload_in_datagram",
                                  ret);
            return ret;
        }

        remaining = (size_t) ret;
        if (remaining == 0) {
            flush = SSL_FORCE_FLUSH;
        } else {
            MBEDTLS_SSL_DEBUG_MSG(2,
                                  ("Still %u bytes available in current datagram",
                                   (unsigned) remaining));
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    if ((flush == SSL_FORCE_FLUSH) &&
        (ret = mbedtls_ssl_flush_output(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_flush_output", ret);
        return ret;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write record"));

    return 0;
}